

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall PSBTInput::Serialize<DataStream>(PSBTInput *this,DataStream *s)

{
  bool bVar1;
  CTxOut *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *entry_1;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range2_1;
  PSBTProprietary *entry;
  set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *__range2;
  type *origin;
  type *leaf_hashes;
  type *leaf_origin;
  type *xonly_1;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *__range3_7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control_block;
  type *__range4;
  type *leaf_ver;
  type *script;
  type *control_blocks;
  type *leaf;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *__range3_6;
  type *leaf_hash;
  type *xonly;
  type *sig;
  type *pubkey_leaf;
  map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3_5;
  type *preimage_3;
  type *hash_3;
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3_4;
  type *preimage_2;
  type *hash_2;
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3_3;
  type *preimage_1;
  type *hash_1;
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3_2;
  type *preimage;
  type *hash;
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3_1;
  pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *sig_pair;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *__range3;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  const_iterator __end3_7;
  const_iterator __begin3_7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_v;
  iterator __end4;
  iterator __begin4;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  const_iterator __end3;
  const_iterator __begin3;
  pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>
  *in_stack_fffffffffffffb88;
  Span<const_unsigned_char> *in_stack_fffffffffffffb90;
  CTxOut *in_stack_fffffffffffffb98;
  CTxOut *in_stack_fffffffffffffba0;
  VectorWriter *in_stack_fffffffffffffba8;
  DataStream *in_stack_fffffffffffffbb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbb8;
  XOnlyPubKey *in_stack_fffffffffffffbc8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffbd8;
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  *in_stack_fffffffffffffbe8;
  DataStream *in_stack_fffffffffffffbf0;
  CompactSizeWriter in_stack_fffffffffffffc28;
  uchar local_189 [25];
  undefined1 local_170 [24];
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_58;
  _Base_ptr local_50;
  ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_fffffffffffffb88);
  if (bVar1) {
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a208);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffba0,
               (CompactSizeWriter *)in_stack_fffffffffffffb98);
    local_40 = TransactionSerParams::operator()
                         ((TransactionSerParams *)in_stack_fffffffffffffb98,
                          (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb90);
    SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
              ((DataStream *)in_stack_fffffffffffffba0,
               (ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)
               in_stack_fffffffffffffb98);
  }
  bVar1 = CTxOut::IsNull((CTxOut *)in_stack_fffffffffffffb88);
  if (!bVar1) {
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a29d);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffba0,
               (CompactSizeWriter *)in_stack_fffffffffffffb98);
    SerializeToVector<DataStream,CTxOut>
              ((DataStream *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffb88);
  if ((bVar1) &&
     (bVar1 = CScriptWitness::IsNull((CScriptWitness *)in_stack_fffffffffffffb88), bVar1)) {
    local_50 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        *)in_stack_fffffffffffffb90);
    local_58 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_fffffffffffffb88);
      in_stack_fffffffffffffc28.n = (uint64_t)in_RSI;
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a399);
      Span<const_unsigned_char>::Span<CPubKey>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                 (CPubKey *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    bVar1 = std::operator==(in_RDI + 0x318);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a440);
      SerializeToVector<DataStream,CompactSizeWriter>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98);
      std::optional<int>::operator*((optional<int> *)in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,int>
                ((DataStream *)in_stack_fffffffffffffba0,(int *)in_stack_fffffffffffffb98);
    }
    bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffb88
                      );
    if (!bVar1) {
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a4c0);
      SerializeToVector<DataStream,CompactSizeWriter>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,(CScript *)in_stack_fffffffffffffb90);
    }
    bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffb88
                      );
    if (!bVar1) {
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a525);
      SerializeToVector<DataStream,CompactSizeWriter>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,(CScript *)in_stack_fffffffffffffb90);
    }
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a585);
    SerializeHDKeypaths<DataStream>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffc28);
    local_98 = (_Base_ptr)
               std::
               map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::begin((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffb90);
    local_a0 = (_Base_ptr)
               std::
               map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::end((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::get<0ul,uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      std::get<1ul,uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a65a);
      Span<const_unsigned_char>::Span<uint160>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                 (uint160 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    local_c0 = (_Base_ptr)
               std::
               map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::begin((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffb90);
    local_c8 = (_Base_ptr)
               std::
               map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::end((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::get<0ul,uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      std::get<1ul,uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a772);
      Span<const_unsigned_char>::Span<uint256>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                 (uint256 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    local_e8 = (_Base_ptr)
               std::
               map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::begin((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffb90);
    local_f0 = (_Base_ptr)
               std::
               map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::end((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::get<0ul,uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      std::get<1ul,uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a88a);
      Span<const_unsigned_char>::Span<uint160>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                 (uint160 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    local_110 = (_Base_ptr)
                std::
                map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::begin((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)in_stack_fffffffffffffb90);
    local_118 = (_Base_ptr)
                std::
                map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::end((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::get<0ul,uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      std::get<1ul,uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                 )in_stack_fffffffffffffb88);
      in_stack_fffffffffffffbd8._M_current = (uchar *)in_RSI;
      CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0a9a2);
      Span<const_unsigned_char>::Span<uint256>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                 (uint256 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                ((DataStream *)in_stack_fffffffffffffba0,
                 (CompactSizeWriter *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffb98);
    if (!bVar1) {
      SerializeToVector<DataStream,unsigned_char>
                ((DataStream *)in_stack_fffffffffffffba0,(uchar *)in_stack_fffffffffffffb98);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
    }
    local_138 = (_Base_ptr)
                std::
                map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::begin((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)in_stack_fffffffffffffb90);
    local_140 = (_Base_ptr)
                std::
                map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::end((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::
      get<0ul,std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffb88);
      std::
      get<1ul,std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffb88);
      std::get<0ul,XOnlyPubKey,uint256>((pair<XOnlyPubKey,_uint256> *)in_stack_fffffffffffffb88);
      std::get<1ul,XOnlyPubKey,uint256>((pair<XOnlyPubKey,_uint256> *)in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,unsigned_char,XOnlyPubKey,uint256>
                (in_stack_fffffffffffffbb0,(uchar *)in_stack_fffffffffffffba8,
                 (XOnlyPubKey *)in_stack_fffffffffffffba0,(uint256 *)in_stack_fffffffffffffb98);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    local_148 = (_Base_ptr)
                std::
                map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                ::begin((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                         *)in_stack_fffffffffffffb90);
    local_150 = (_Base_ptr)
                std::
                map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                ::end((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)in_stack_fffffffffffffb88);
      std::
      get<0ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                ((pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffb88);
      std::
      get<1ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                ((pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffb88);
      std::get<0ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                 in_stack_fffffffffffffb88);
      std::get<1ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                 in_stack_fffffffffffffb88);
      local_158 = (_Base_ptr)
                  std::
                  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::begin((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)in_stack_fffffffffffffb90);
      local_170._16_8_ =
           std::
           set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::end((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffb90);
      while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                     (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0
            ) {
        std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        operator*((_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffb88);
        in_stack_fffffffffffffbc8 = (XOnlyPubKey *)local_170;
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffb98,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        SerializeToVector<DataStream,unsigned_char,Span<unsigned_char_const>>
                  ((DataStream *)in_stack_fffffffffffffba0,(uchar *)in_stack_fffffffffffffb98,
                   in_stack_fffffffffffffb90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb90);
        __last._M_current = local_189;
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)in_stack_fffffffffffffb88);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbd8,__last,
                   (allocator_type *)in_stack_fffffffffffffbb0);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)in_stack_fffffffffffffb88);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb88,(value_type_conflict3 *)0xe0ad84);
        DataStream::operator<<
                  ((DataStream *)in_stack_fffffffffffffb98,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb98);
        std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        operator++((_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffb88);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    std::
    map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
    ::begin((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
             *)in_stack_fffffffffffffb90);
    std::
    map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
    ::end((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
           *)in_stack_fffffffffffffb90);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                   (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                   *)in_stack_fffffffffffffb88);
      std::
      get<0ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                (in_stack_fffffffffffffb88);
      std::
      get<1ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                (in_stack_fffffffffffffb88);
      std::get<0ul,std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>
                ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)in_stack_fffffffffffffb88);
      std::get<1ul,std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>
                ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)in_stack_fffffffffffffb88);
      SerializeToVector<DataStream,unsigned_char,XOnlyPubKey>
                ((DataStream *)in_stack_fffffffffffffba0,(uchar *)in_stack_fffffffffffffb98,
                 (XOnlyPubKey *)in_stack_fffffffffffffb90);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb88)
      ;
      VectorWriter::VectorWriter
                (in_stack_fffffffffffffba8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffba0,
                 (size_t)in_stack_fffffffffffffb98);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffb98,
                 (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                 in_stack_fffffffffffffb90);
      KeyOriginInfo::KeyOriginInfo
                ((KeyOriginInfo *)in_stack_fffffffffffffb88,(KeyOriginInfo *)0xe0af6f);
      SerializeKeyOrigin<VectorWriter>
                (in_stack_fffffffffffffba8,(KeyOriginInfo *)in_stack_fffffffffffffba0);
      KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffb88);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb98)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                    *)in_stack_fffffffffffffb88);
    }
    bVar1 = XOnlyPubKey::IsNull(&in_stack_fffffffffffffb88->first);
    if (!bVar1) {
      SerializeToVector<DataStream,unsigned_char>
                ((DataStream *)in_stack_fffffffffffffba0,(uchar *)in_stack_fffffffffffffb98);
      ToByteVector<XOnlyPubKey>(in_stack_fffffffffffffbc8);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffffb98,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb98)
      ;
    }
    bVar1 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffb98);
    if (!bVar1) {
      SerializeToVector<DataStream,unsigned_char>
                ((DataStream *)in_stack_fffffffffffffba0,(uchar *)in_stack_fffffffffffffb98);
      SerializeToVector<DataStream,uint256>
                ((DataStream *)in_stack_fffffffffffffba0,(uint256 *)in_stack_fffffffffffffb98);
    }
  }
  bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffb88);
  if (!bVar1) {
    in_stack_fffffffffffffba0 = in_RSI;
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0b142);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffba0,
               (CompactSizeWriter *)in_stack_fffffffffffffb98);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffb98,(CScript *)in_stack_fffffffffffffb90);
  }
  bVar1 = CScriptWitness::IsNull((CScriptWitness *)in_stack_fffffffffffffb88);
  if (!bVar1) {
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffb88,0xe0b1a4);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffba0,(CompactSizeWriter *)in_RSI);
    SerializeToVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((DataStream *)in_stack_fffffffffffffba0,
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_RSI);
    in_stack_fffffffffffffb98 = in_RSI;
  }
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::begin
            ((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *)
             in_stack_fffffffffffffb90);
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::end
            ((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *)
             in_stack_fffffffffffffb90);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                 (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator*
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffb88);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffb98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffb98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator++
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffb88);
  }
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)in_stack_fffffffffffffb90);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_fffffffffffffb90);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                                 (_Self *)in_stack_fffffffffffffb90), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_fffffffffffffb88);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffb98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffb98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffb88);
  }
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffb98,(uchar *)in_stack_fffffffffffffb90)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the utxo
        if (non_witness_utxo) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_NON_WITNESS_UTXO));
            SerializeToVector(s, TX_NO_WITNESS(non_witness_utxo));
        }
        if (!witness_utxo.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESS_UTXO));
            SerializeToVector(s, witness_utxo);
        }

        if (final_script_sig.empty() && final_script_witness.IsNull()) {
            // Write any partial signatures
            for (const auto& sig_pair : partial_sigs) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_PARTIAL_SIG), Span{sig_pair.second.first});
                s << sig_pair.second.second;
            }

            // Write the sighash type
            if (sighash_type != std::nullopt) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SIGHASH));
                SerializeToVector(s, *sighash_type);
            }

            // Write the redeem script
            if (!redeem_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_REDEEMSCRIPT));
                s << redeem_script;
            }

            // Write the witness script
            if (!witness_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESSSCRIPT));
                s << witness_script;
            }

            // Write any hd keypaths
            SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_IN_BIP32_DERIVATION));

            // Write any ripemd160 preimage
            for (const auto& [hash, preimage] : ripemd160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_RIPEMD160), Span{hash});
                s << preimage;
            }

            // Write any sha256 preimage
            for (const auto& [hash, preimage] : sha256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SHA256), Span{hash});
                s << preimage;
            }

            // Write any hash160 preimage
            for (const auto& [hash, preimage] : hash160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH160), Span{hash});
                s << preimage;
            }

            // Write any hash256 preimage
            for (const auto& [hash, preimage] : hash256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH256), Span{hash});
                s << preimage;
            }

            // Write taproot key sig
            if (!m_tap_key_sig.empty()) {
                SerializeToVector(s, PSBT_IN_TAP_KEY_SIG);
                s << m_tap_key_sig;
            }

            // Write taproot script sigs
            for (const auto& [pubkey_leaf, sig] : m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                SerializeToVector(s, PSBT_IN_TAP_SCRIPT_SIG, xonly, leaf_hash);
                s << sig;
            }

            // Write taproot leaf scripts
            for (const auto& [leaf, control_blocks] : m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                for (const auto& control_block : control_blocks) {
                    SerializeToVector(s, PSBT_IN_TAP_LEAF_SCRIPT, Span{control_block});
                    std::vector<unsigned char> value_v(script.begin(), script.end());
                    value_v.push_back((uint8_t)leaf_ver);
                    s << value_v;
                }
            }

            // Write taproot bip32 keypaths
            for (const auto& [xonly, leaf_origin] : m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                SerializeToVector(s, PSBT_IN_TAP_BIP32_DERIVATION, xonly);
                std::vector<unsigned char> value;
                VectorWriter s_value{value, 0};
                s_value << leaf_hashes;
                SerializeKeyOrigin(s_value, origin);
                s << value;
            }

            // Write taproot internal key
            if (!m_tap_internal_key.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_INTERNAL_KEY);
                s << ToByteVector(m_tap_internal_key);
            }

            // Write taproot merkle root
            if (!m_tap_merkle_root.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_MERKLE_ROOT);
                SerializeToVector(s, m_tap_merkle_root);
            }
        }

        // Write script sig
        if (!final_script_sig.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTSIG));
            s << final_script_sig;
        }
        // write script witness
        if (!final_script_witness.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTWITNESS));
            SerializeToVector(s, final_script_witness.stack);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }